

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void solver_updated_cb(int remaining_constraints,double value,long loop,double duration,
                      long reinit_number)

{
  long in_RSI;
  int in_EDI;
  long local_30;
  double local_28;
  int local_1c;
  long local_18;
  double local_10;
  long local_8;
  
  if (in_EDI < 1) {
    if (in_RSI < 0) {
      local_8 = -in_RSI;
      fmt::v7::print<char[64],double&,long,double&,long&,char>
                ((char (*) [64])"  - Solution found via push: {:f} (loop: {} t: {}s reinit: {})\n",
                 &local_10,&local_8,&local_28,&local_30);
    }
    else {
      fmt::v7::print<char[55],double&,long&,double&,long&,char>
                ((char (*) [55])"  - Solution found: {:f} (loop: {} t: {}s reinit: {})\n",&local_10,
                 &local_18,&local_28,&local_30);
    }
  }
  else {
    fmt::v7::print<char[60],int&,long&,double&,long&,char>
              ((char (*) [60])"  - Constraints remaining: {} (loop: {} t: {}s reinit: {})\n",
               &local_1c,&local_18,&local_28,&local_30);
  }
  return;
}

Assistant:

static void
solver_updated_cb(int remaining_constraints,
                  double value,
                  long int loop,
                  double duration,
                  long int reinit_number)
{
    if (remaining_constraints > 0) {
        fmt::print(
          "  - Constraints remaining: {} (loop: {} t: {}s reinit: {})\n",
          remaining_constraints,
          loop,
          duration,
          reinit_number);
    } else {
        if (loop >= 0)
            fmt::print(
              "  - Solution found: {:f} (loop: {} t: {}s reinit: {})\n",
              value,
              loop,
              duration,
              reinit_number);
        else
            fmt::print("  - Solution found via push: {:f} (loop: {} t: {}s "
                       "reinit: {})\n",
                       value,
                       -loop,
                       duration,
                       reinit_number);
    }
}